

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTimeSpan(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  smatch match;
  undefined2 local_90;
  undefined1 local_8e;
  undefined2 local_8c;
  undefined1 local_8a;
  char local_88;
  string_type local_80;
  ulong local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,
               "(\\d\\d\\d\\d)/(\\d\\d\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (s->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),&local_58,
                     &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&local_58,1);
    if (local_80._M_string_length == 4) {
      uVar11 = 0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        if ((byte)(local_80._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) {
          bVar4 = 0;
          goto LAB_001a5d53;
        }
        uVar6 = (uint)(byte)(local_80._M_dataplus._M_p[lVar5] - 0x30) + uVar6 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      bVar4 = 1;
      uVar11 = (ulong)uVar6;
LAB_001a5d53:
      lVar5 = 0;
      iVar3 = 0;
      do {
        bVar8 = local_80._M_dataplus._M_p[lVar5 + 2] - 0x30;
        if (9 < bVar8) {
          iVar3 = 0;
          break;
        }
        iVar3 = (uint)bVar8 + iVar3 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      if ((bVar8 < 10 & bVar4) == 0) goto LAB_001a5da1;
      uVar11 = uVar11 | (ulong)bVar4 << 0x20;
      local_88 = '\x01';
    }
    else {
LAB_001a5da1:
      local_8a = 0;
      local_8c = 0;
      local_88 = '\0';
      iVar3 = 0;
      uVar11 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&local_58,2);
    if (local_80._M_string_length == 4) {
      iVar2 = 0;
      lVar5 = 0;
      iVar7 = 0;
      do {
        if ((byte)(local_80._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) {
          bVar4 = 0;
          goto LAB_001a5e33;
        }
        iVar7 = (uint)(byte)(local_80._M_dataplus._M_p[lVar5] - 0x30) + iVar7 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      bVar4 = 1;
      iVar2 = iVar7;
LAB_001a5e33:
      lVar5 = 0;
      iVar7 = 0;
      do {
        bVar8 = local_80._M_dataplus._M_p[lVar5 + 2] - 0x30;
        if (9 < bVar8) {
          iVar7 = 0;
          break;
        }
        iVar7 = (uint)bVar8 + iVar7 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      if ((bVar8 < 10 & bVar4) == 0) goto LAB_001a5e7c;
      uVar9 = (ulong)CONCAT14(bVar4,iVar2);
      cVar10 = '\x01';
    }
    else {
LAB_001a5e7c:
      local_8e = 0;
      local_90 = 0;
      uVar9 = 0;
      iVar7 = 0;
      cVar10 = '\0';
    }
    local_60 = uVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((local_88 != '\0') && (cVar10 != '\0')) {
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
           local_8a;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
           local_8c;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
           local_90;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
           local_8e;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload = 7;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup = true;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0xc) = local_60;
      *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14)
           = iVar3;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
      *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c
               ) = local_88;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x20) = uVar9;
      *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28)
           = iVar7;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) = 0;
      *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30
               ) = cVar10;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      goto LAB_001a5f23;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_001a5f23:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTimeSpan(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("(\\d\\d\\d\\d)/(\\d\\d\\d\\d)");
	static const auto matchFrom = 1, matchTill = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto from = MetafTime::fromStringDDHH(match.str(matchFrom));
	const auto till = MetafTime::fromStringDDHH(match.str(matchTill));
	if (!from.has_value() || !till.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::TIME_SPAN;
	result.isTafTimeSpanGroup = true;
	result.tFrom = from;
	result.tTill = till;
	return result;
}